

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void __thiscall
dlib::cpu::pooling::setup_max_pooling
          (pooling *this,int window_height_,int window_width_,int stride_y_,int stride_x_,
          int padding_y_,int padding_x_)

{
  ostream *poVar1;
  undefined8 uVar2;
  ostream *poVar3;
  string *a;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  ostringstream dlib_o_out_5;
  ostringstream dlib_o_out_4;
  ostringstream dlib_o_out_3;
  ostringstream dlib_o_out_2;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  string *in_stack_fffffffffffff3e0;
  undefined8 in_stack_fffffffffffff3e8;
  error_type eVar4;
  fatal_error *in_stack_fffffffffffff3f0;
  ostream local_9c8;
  undefined1 local_849;
  ostream local_828;
  undefined1 local_6a9;
  ostream local_688;
  undefined1 local_509;
  ostream local_4e8;
  undefined1 local_369;
  ostream local_348;
  undefined1 local_1c9;
  ostream local_198;
  
  eVar4 = (error_type)((ulong)in_stack_fffffffffffff3e8 >> 0x20);
  if (in_EDX < 1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    poVar1 = std::operator<<(&local_198,"\n\nError detected at line ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x649);
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<(&local_198,"Error detected in file ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<(&local_198,"Error detected in function ");
    poVar1 = std::operator<<(poVar1,
                             "void dlib::cpu::pooling::setup_max_pooling(int, int, int, int, int, int)"
                            );
    std::operator<<(poVar1,".\n\n");
    poVar1 = std::operator<<(&local_198,"Failing expression was ");
    poVar1 = std::operator<<(poVar1,"window_width_ > 0");
    std::operator<<(poVar1,".\n");
    poVar1 = (ostream *)std::ostream::operator<<(&local_198,std::boolalpha);
    poVar1 = std::operator<<(poVar1,"");
    std::operator<<(poVar1,"\n");
    local_1c9 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffff3f0,eVar4,in_stack_fffffffffffff3e0);
    local_1c9 = 0;
    __cxa_throw(uVar2,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  if (in_ESI < 1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_348);
    poVar1 = std::operator<<(&local_348,"\n\nError detected at line ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x64a);
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<(&local_348,"Error detected in file ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<(&local_348,"Error detected in function ");
    poVar1 = std::operator<<(poVar1,
                             "void dlib::cpu::pooling::setup_max_pooling(int, int, int, int, int, int)"
                            );
    std::operator<<(poVar1,".\n\n");
    poVar1 = std::operator<<(&local_348,"Failing expression was ");
    poVar1 = std::operator<<(poVar1,"window_height_ > 0");
    std::operator<<(poVar1,".\n");
    poVar1 = (ostream *)std::ostream::operator<<(&local_348,std::boolalpha);
    poVar1 = std::operator<<(poVar1,"");
    std::operator<<(poVar1,"\n");
    local_369 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffff3f0,eVar4,in_stack_fffffffffffff3e0);
    local_369 = 0;
    __cxa_throw(uVar2,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  if (in_ECX < 1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4e8);
    poVar1 = std::operator<<(&local_4e8,"\n\nError detected at line ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x64b);
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<(&local_4e8,"Error detected in file ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<(&local_4e8,"Error detected in function ");
    poVar1 = std::operator<<(poVar1,
                             "void dlib::cpu::pooling::setup_max_pooling(int, int, int, int, int, int)"
                            );
    std::operator<<(poVar1,".\n\n");
    poVar1 = std::operator<<(&local_4e8,"Failing expression was ");
    poVar1 = std::operator<<(poVar1,"stride_y_ > 0");
    std::operator<<(poVar1,".\n");
    poVar1 = (ostream *)std::ostream::operator<<(&local_4e8,std::boolalpha);
    poVar1 = std::operator<<(poVar1,"");
    std::operator<<(poVar1,"\n");
    local_509 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffff3f0,eVar4,in_stack_fffffffffffff3e0);
    local_509 = 0;
    __cxa_throw(uVar2,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  if (in_R8D < 1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_688);
    poVar1 = std::operator<<(&local_688,"\n\nError detected at line ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x64c);
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<(&local_688,"Error detected in file ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<(&local_688,"Error detected in function ");
    poVar1 = std::operator<<(poVar1,
                             "void dlib::cpu::pooling::setup_max_pooling(int, int, int, int, int, int)"
                            );
    std::operator<<(poVar1,".\n\n");
    poVar1 = std::operator<<(&local_688,"Failing expression was ");
    poVar1 = std::operator<<(poVar1,"stride_x_ > 0");
    std::operator<<(poVar1,".\n");
    poVar1 = (ostream *)std::ostream::operator<<(&local_688,std::boolalpha);
    poVar1 = std::operator<<(poVar1,"");
    std::operator<<(poVar1,"\n");
    local_6a9 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffff3f0,eVar4,in_stack_fffffffffffff3e0);
    local_6a9 = 0;
    __cxa_throw(uVar2,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  if ((in_R9D < 0) || (in_ESI <= in_R9D)) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_828);
    poVar1 = std::operator<<(&local_828,"\n\nError detected at line ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x64d);
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<(&local_828,"Error detected in file ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                            );
    std::operator<<(poVar1,".\n");
    poVar1 = std::operator<<(&local_828,"Error detected in function ");
    poVar1 = std::operator<<(poVar1,
                             "void dlib::cpu::pooling::setup_max_pooling(int, int, int, int, int, int)"
                            );
    std::operator<<(poVar1,".\n\n");
    poVar1 = std::operator<<(&local_828,"Failing expression was ");
    poVar1 = std::operator<<(poVar1,"0 <= padding_y_ && padding_y_ < window_height_");
    std::operator<<(poVar1,".\n");
    poVar1 = (ostream *)std::ostream::operator<<(&local_828,std::boolalpha);
    poVar1 = std::operator<<(poVar1,"");
    std::operator<<(poVar1,"\n");
    local_849 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error(in_stack_fffffffffffff3f0,eVar4,in_stack_fffffffffffff3e0);
    local_849 = 0;
    __cxa_throw(uVar2,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  if ((-1 < in_stack_00000008) && (in_stack_00000008 < in_EDX)) {
    *in_RDI = in_ESI;
    in_RDI[1] = in_EDX;
    in_RDI[2] = in_ECX;
    in_RDI[3] = in_R8D;
    in_RDI[4] = in_R9D;
    in_RDI[5] = in_stack_00000008;
    *(undefined1 *)(in_RDI + 6) = 1;
    return;
  }
  dlib_assert_breakpoint();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_9c8);
  poVar1 = std::operator<<(&local_9c8,"\n\nError detected at line ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x64e);
  std::operator<<(poVar1,".\n");
  poVar1 = std::operator<<(&local_9c8,"Error detected in file ");
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/dnn/cpu_dlib.cpp"
                          );
  std::operator<<(poVar1,".\n");
  poVar1 = std::operator<<(&local_9c8,"Error detected in function ");
  poVar1 = std::operator<<(poVar1,
                           "void dlib::cpu::pooling::setup_max_pooling(int, int, int, int, int, int)"
                          );
  std::operator<<(poVar1,".\n\n");
  poVar3 = std::operator<<(&local_9c8,"Failing expression was ");
  a = (string *)std::operator<<(poVar3,"0 <= padding_x_ && padding_x_ < window_width_");
  eVar4 = (error_type)((ulong)poVar3 >> 0x20);
  std::operator<<((ostream *)a,".\n");
  poVar3 = (ostream *)std::ostream::operator<<(&local_9c8,std::boolalpha);
  poVar3 = std::operator<<(poVar3,"");
  std::operator<<(poVar3,"\n");
  uVar2 = __cxa_allocate_exception(0x30);
  std::__cxx11::ostringstream::str();
  fatal_error::fatal_error((fatal_error *)poVar1,eVar4,a);
  __cxa_throw(uVar2,&fatal_error::typeinfo,fatal_error::~fatal_error);
}

Assistant:

void pooling::
        setup_max_pooling(
            int window_height_,
            int window_width_,
            int stride_y_,
            int stride_x_,
            int padding_y_,
            int padding_x_
        )
        {
            DLIB_CASSERT(window_width_ > 0);
            DLIB_CASSERT(window_height_ > 0);
            DLIB_CASSERT(stride_y_ > 0);
            DLIB_CASSERT(stride_x_ > 0);
            DLIB_CASSERT(0 <= padding_y_ && padding_y_ < window_height_);
            DLIB_CASSERT(0 <= padding_x_ && padding_x_ < window_width_);

            window_height = window_height_;
            window_width = window_width_;
            stride_y = stride_y_;
            stride_x = stride_x_;
            padding_y = padding_y_;
            padding_x = padding_x_;
            do_max_pooling = true;
        }